

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O2

bool tcu::anyNotEqual<unsigned_int,4>(Vector<unsigned_int,_4> *a,Vector<unsigned_int,_4> *b)

{
  bool bVar1;
  int i;
  long lVar2;
  bool bVar3;
  
  bVar3 = false;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    bVar1 = !bVar3;
    bVar3 = true;
    if (bVar1) {
      bVar3 = a->m_data[lVar2] != b->m_data[lVar2];
    }
  }
  return bVar3;
}

Assistant:

inline bool anyNotEqual (const Vector<T, Size>& a, const Vector<T, Size>& b)
{
	bool res = false;
	for (int i = 0; i < Size; i++)
		res = res || a.m_data[i] != b.m_data[i];
	return res;
}